

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_NtkShowBdd(Abc_Ntk_t *pNtk,int fCompl)

{
  int iVar1;
  uint uVar2;
  DdManager *dd;
  Vec_Ptr_t *p;
  long *plVar3;
  int *piVar4;
  void *pvVar5;
  undefined8 uVar6;
  FILE *__stream;
  char **inames;
  char **onames;
  DdNode **f;
  DdNode *pDVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  char FileNameDot [200];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                  ,0x85,"void Abc_NtkShowBdd(Abc_Ntk_t *, int)");
  }
  iVar11 = 0;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    puts("Construction of global BDDs has failed.");
    return;
  }
  p = Vec_PtrAlloc(pNtk->vCos->nSize);
  while( true ) {
    if (pNtk->vCos->nSize <= iVar11) {
      Abc_ShowGetFileName(pNtk->pName,FileNameDot);
      __stream = fopen(FileNameDot,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
      }
      else {
        uVar10 = 0;
        inames = Abc_NtkCollectCioNames(pNtk,0);
        onames = Abc_NtkCollectCioNames(pNtk,1);
        if (fCompl == 0) {
          uVar2 = p->nSize;
          f = (DdNode **)malloc((long)(int)uVar2 << 3);
          uVar12 = 0;
          if (0 < (int)uVar2) {
            uVar12 = (ulong)uVar2;
          }
          for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            pDVar7 = (DdNode *)Vec_PtrEntry(p,(int)uVar10);
            pDVar7 = Cudd_BddToAdd(dd,pDVar7);
            f[uVar10] = pDVar7;
            Cudd_Ref(pDVar7);
          }
          Cudd_DumpDot(dd,pNtk->vCos->nSize,f,inames,onames,(FILE *)__stream);
          for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
            Vec_PtrEntry(p,(int)uVar10);
            Cudd_RecursiveDeref(dd,f[uVar10]);
          }
          free(f);
        }
        else {
          Cudd_DumpDot(dd,pNtk->vCos->nSize,(DdNode **)p->pArray,inames,onames,(FILE *)__stream);
        }
        free(inames);
        free(onames);
        fclose(__stream);
        Abc_NtkFreeGlobalBdds(pNtk,0);
        iVar11 = p->nSize;
        for (iVar9 = 0; iVar9 < iVar11; iVar9 = iVar9 + 1) {
          pDVar7 = (DdNode *)Vec_PtrEntry(p,iVar9);
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        Vec_PtrFree(p);
        Extra_StopManager(dd);
        Abc_NtkCleanCopy(pNtk);
        Abc_ShowFile(FileNameDot);
      }
      return;
    }
    plVar3 = (long *)Vec_PtrEntry(pNtk->vCos,iVar11);
    piVar4 = (int *)Vec_PtrEntry(*(Vec_Ptr_t **)(*plVar3 + 0x1b0),7);
    pvVar5 = *(void **)(piVar4 + 2);
    if (pvVar5 == (void *)0x0) break;
    iVar9 = (int)plVar3[2];
    lVar8 = (long)iVar9;
    iVar1 = *piVar4;
    if (iVar1 <= iVar9) {
      iVar13 = iVar9 + 10;
      if (iVar9 < iVar1 * 2) {
        iVar13 = iVar1 * 2;
      }
      if (iVar1 < iVar13) {
        pvVar5 = realloc(pvVar5,(long)iVar13 * 8);
        *(void **)(piVar4 + 2) = pvVar5;
        memset((void *)((long)pvVar5 + (long)*piVar4 * 8),0,((long)iVar13 - (long)*piVar4) * 8);
        *piVar4 = iVar13;
      }
    }
    pvVar5 = *(void **)((long)pvVar5 + lVar8 * 8);
    if (pvVar5 == (void *)0x0) {
      if (*(code **)(piVar4 + 8) == (code *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        uVar6 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
        *(undefined8 *)(*(long *)(piVar4 + 2) + lVar8 * 8) = uVar6;
        pvVar5 = *(void **)(*(long *)(piVar4 + 2) + lVar8 * 8);
      }
    }
    Vec_PtrPush(p,pvVar5);
    iVar11 = iVar11 + 1;
  }
  __assert_fail("p->pArrayPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
}

Assistant:

void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl )
{
    char FileNameDot[200];
    char ** ppNamesIn, ** ppNamesOut;
    DdManager * dd; DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj; int i;
    FILE * pFile;

    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, 0 );
    if ( dd == NULL )
    {
        printf( "Construction of global BDDs has failed.\n" );
        return;
    }
    //printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // create the file name
    Abc_ShowGetFileName( pNtk->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    ppNamesIn = Abc_NtkCollectCioNames( pNtk, 0 );
    ppNamesOut = Abc_NtkCollectCioNames( pNtk, 1 );
    if ( fCompl )
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), (DdNode **)Vec_PtrArray(vFuncsGlob), ppNamesIn, ppNamesOut, pFile );
    else
    {
        DdNode ** pbAdds = ABC_ALLOC( DdNode *, Vec_PtrSize(vFuncsGlob) );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            { pbAdds[i] = Cudd_BddToAdd( dd, bFunc ); Cudd_Ref( pbAdds[i] ); }
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), pbAdds, ppNamesIn, ppNamesOut, pFile );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, pbAdds[i] );
        ABC_FREE( pbAdds );
    }
    ABC_FREE( ppNamesIn );
    ABC_FREE( ppNamesOut );
    fclose( pFile );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 0 );
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    Abc_NtkCleanCopy( pNtk );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}